

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O3

void __thiscall spdlog::details::q_formatter::format(q_formatter *this,log_msg *msg,tm *param_2)

{
  char *local_30;
  long local_28;
  char local_20 [16];
  
  os::thread_name_abi_cxx11_();
  fmt::Buffer<char>::append<char>
            ((msg->formatted).super_BasicWriter<char>.buffer_,local_30,local_30 + local_28);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &) override
    {	
        msg.formatted << os::thread_name();
    }